

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O3

void __thiscall GOESRImageHandler::handleImage(GOESRImageHandler *this,GOESRProduct *product)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  int iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  unique_ptr<Image,_std::default_delete<Image>_> image;
  string path;
  Timer t;
  Mat mat;
  map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  idf;
  FilenameBuilder fb;
  undefined1 local_4d8 [8];
  undefined1 local_4d0 [8];
  float local_4c8;
  float local_4c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  Timer local_4b0;
  string local_4a8;
  undefined1 local_488 [104];
  _Rb_tree_node_base local_420;
  undefined1 local_400 [384];
  FilenameBuilder local_280;
  
  Timer::Timer(&local_4b0);
  if (*(long *)&(this->config_).field_0x158 == 0) {
    GOESRProduct::getImage((GOESRProduct *)local_4d8,(Handler *)product);
    GOESRProduct::getFilenameBuilder(&local_280,product,&this->config_);
    this_00 = &(this->config_).gradient;
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
            ::find(&this_00->_M_t,&(product->product_).nameShort);
    p_Var1 = &(this->config_).gradient._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
      iVar3 = std::__cxx11::string::compare((char *)&product->product_);
      if (iVar3 == 0) {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
                ::find(&this_00->_M_t,&(product->channel_).nameShort);
      }
    }
    GOESRProduct::loadImageDataFunction
              ((map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                *)(local_488 + 0x60),product);
    if (((_Rb_tree_header *)iVar4._M_node != p_Var1) && (local_400._0_8_ == 0x100)) {
      cv::Mat::Mat((Mat *)local_488,0x100,1,0x10);
      if (local_420._M_left != &local_420) {
        p_Var5 = local_420._M_left;
        do {
          Gradient::interpolate
                    ((GradientPoint *)local_4d0,(Gradient *)(iVar4._M_node + 2),
                     *(float *)&p_Var5[1].field_0x4,(this->config_).lerptype);
          *(char *)(local_488._16_8_ + (ulong)(p_Var5[1]._M_color * 3)) =
               (char)(int)(local_4c4 * 255.0);
          *(char *)(local_488._16_8_ + (ulong)(p_Var5[1]._M_color * 3 + 1)) =
               (char)(int)(local_4c8 * 255.0);
          *(char *)(local_488._16_8_ + (ulong)(p_Var5[1]._M_color * 3 + 2)) =
               (char)(int)((float)local_4d0._4_4_ * 255.0);
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != &local_420);
      }
      Image::remap((Image *)local_4d8,(Mat *)local_488);
      cv::Mat::~Mat((Mat *)local_488);
    }
    Image::getRawImage((Image *)local_488);
    pcVar2 = (this->config_).format._M_dataplus._M_p;
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a8,pcVar2,pcVar2 + (this->config_).format._M_string_length);
    FilenameBuilder::build((string *)local_4d0,&local_280,&(this->config_).filename,&local_4a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    FileWriter::write((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(int)local_4d0,local_488,(size_t)&local_4b0);
    if ((this->config_).json == true) {
      FileWriter::writeHeader
                ((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(((product->files_).
                          super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 (string *)local_4d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_) != &local_4c0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_),
                      local_4c0._M_allocated_capacity + 1);
    }
    cv::Mat::~Mat((Mat *)local_488);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                 *)(local_488 + 0x60));
    FilenameBuilder::~FilenameBuilder(&local_280);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)local_4d8);
  }
  else {
    GOESRProduct::GOESRProduct((GOESRProduct *)(local_400 + 8),product);
    handleImageForFalseColor(this,(GOESRProduct *)(local_400 + 8));
    GOESRProduct::~GOESRProduct((GOESRProduct *)(local_400 + 8));
  }
  return;
}

Assistant:

void GOESRImageHandler::handleImage(GOESRProduct product) {
  Timer t;

  // If this handler is configured to produce false color images
  // we pass the image to a separate handler.
  if (config_.lut.data) {
    handleImageForFalseColor(std::move(product));
    return;
  }

  auto image = product.getImage(config_);
  auto fb = product.getFilenameBuilder(config_);

  // If there's a parametric gradient configured, use it in
  // combination with the LRIT ImageDataFunction to map
  // CMIP grey levels to temperature units (Kelvin), then map
  // those temperatures onto the RGB gradient.
  const auto& productName = product.getProduct().nameShort;
  auto grad = config_.gradient.find(productName);

  // For CMIP files we use the channel name to find the gradient.
  if (grad == std::end(config_.gradient) && productName == "CMIP") {
    grad = config_.gradient.find(product.getChannel().nameShort);
  }

  auto idf = product.loadImageDataFunction();

  // This is stored in an 256x1 RGB matrix for use in Image::remap()
  if (grad != std::end(config_.gradient) && idf.size() == 256) {
    cv::Mat gradientMap(256, 1, CV_8UC3);
    for (const auto& i : idf) {
      auto p = grad->second.interpolate(i.second, config_.lerptype);
      gradientMap.data[i.first * 3] = p.rgb[2] * 255;
      gradientMap.data[i.first * 3 + 1] = p.rgb[1] * 255;
      gradientMap.data[i.first * 3 + 2] = p.rgb[0] * 255;
    }
    image->remap(gradientMap);
  }

  auto mat = image->getRawImage();
  overlayMaps(product, mat);
  auto path = fb.build(config_.filename, config_.format);
  fileWriter_->write(path, mat, &t);
  if (config_.json) {
    fileWriter_->writeHeader(product.firstFile(), path);
  }
}